

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_exhaustive.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint *pk_parity;
  byte bVar1;
  byte bVar2;
  uint64_t uVar3;
  int iVar4;
  undefined4 uVar5;
  int iVar6;
  uint uVar7;
  uchar *p2;
  long lVar8;
  FILE *__stream;
  size_t sVar9;
  secp256k1_ge *psVar10;
  secp256k1_gej *psVar11;
  secp256k1_gej *psVar12;
  secp256k1_context *psVar13;
  secp256k1_scratch *psVar14;
  size_t sVar15;
  ulong uVar16;
  char **ppcVar17;
  void *pvVar18;
  void *pvVar19;
  uchar *puVar20;
  int j;
  int iVar21;
  secp256k1_fe *psVar22;
  void *pvVar23;
  uchar *puVar24;
  ulong uVar25;
  secp256k1_gej *gen;
  secp256k1_gej *gen_00;
  char **ppcVar26;
  secp256k1_context *extraout_RDX;
  int iVar27;
  secp256k1_scalar sVar28;
  secp256k1_gej *a;
  secp256k1_ge_storage (*r) [2];
  _func_void_char_ptr_void_ptr *p_Var29;
  uint64_t *puVar30;
  secp256k1_keypair *keypair;
  uint uVar31;
  uchar *p1;
  long lVar32;
  secp256k1_ge *psVar33;
  undefined1 *puVar34;
  uint uVar35;
  uint64_t *puVar36;
  uchar *puVar37;
  ulong uVar38;
  secp256k1_context *psVar39;
  secp256k1_ge *psVar40;
  secp256k1_scratch *na_00;
  uint64_t uVar41;
  ulong uVar42;
  char cVar43;
  secp256k1_pubkey *pubkey;
  int pos;
  int iVar44;
  secp256k1_scalar sVar45;
  char *pcVar46;
  secp256k1_context *a_00;
  secp256k1_xonly_pubkey *pubkey_00;
  secp256k1_scalar *output32;
  bool bVar47;
  byte bVar48;
  undefined1 auVar49 [16];
  FILE *local_1b18;
  ulong local_1b10;
  ulong local_1b08;
  secp256k1_scalar msg_plus_r_times_sk_s;
  secp256k1_context *local_1af8;
  secp256k1_scalar expected_r_1;
  secp256k1_ge *local_1ae8;
  secp256k1_ge *local_1ae0;
  secp256k1_gej *local_1ad8;
  secp256k1_scalar expected_s;
  secp256k1_scalar expected_r;
  secp256k1_scalar sStack_1ac4;
  secp256k1_nonce_function_hardened p_Stack_1ac0;
  secp256k1_scalar *local_1ab8;
  secp256k1_scalar ng_1;
  undefined1 auStack_1aa4 [12];
  secp256k1_ge *psStack_1aa0;
  undefined1 local_1a98 [16];
  undefined1 local_1a88 [16];
  undefined4 local_1a78;
  secp256k1_scalar ng;
  undefined1 auStack_1a64 [12];
  undefined8 uStack_1a60;
  undefined1 local_1a58 [16];
  int iStack_1a3c;
  secp256k1_scalar na;
  secp256k1_scalar sStack_1a34;
  void *pvStack_1a30;
  _func_void_char_ptr_void_ptr *local_1a28;
  void *pvStack_1a20;
  undefined4 local_1a18;
  undefined4 uStack_1a14;
  undefined8 uStack_1a10;
  secp256k1_context *local_1a00;
  char **local_19f8;
  uint64_t local_19f0;
  uint64_t local_19e8;
  uint64_t local_19e0;
  secp256k1_scalar s;
  undefined1 auStack_19d4 [12];
  undefined1 local_19c8 [16];
  uint64_t local_19b0;
  undefined4 local_19a4;
  ulong local_19a0;
  _func_void_char_ptr_void_ptr *local_1998;
  secp256k1_ge *local_1990;
  _func_void_char_ptr_void_ptr *local_1988;
  secp256k1_scratch *local_1980;
  ulong local_1978;
  secp256k1_scratch *local_1970;
  secp256k1_ge *local_1968;
  ulong local_1960;
  secp256k1_gej tmp_3;
  undefined1 local_17f8 [32];
  uchar rand32 [32];
  secp256k1_scalar scalar_i;
  undefined1 auStack_17b4 [12];
  uint64_t uStack_17b0;
  undefined1 local_17a8 [16];
  uchar local_1798 [4];
  uchar auStack_1794 [4];
  int iStack_1790;
  int iStack_178c;
  uchar seed16 [16];
  uchar local_1498 [32];
  byte local_1478;
  uint64_t local_1448 [122];
  secp256k1_pubkey sStack_1078;
  secp256k1_ge generated;
  secp256k1_ge group [13];
  undefined1 auStack_7f0 [8];
  secp256k1_gej groupj [13];
  
  bVar48 = 0;
  setbuf(_stdout,(char *)0x0);
  setbuf(_stderr,(char *)0x0);
  printf("Exhaustive tests for order %lu\n");
  if (1 < argc) {
    lVar8 = strtol(argv[1],(char **)0x0,0);
    count = (int)lVar8;
  }
  pcVar46 = (char *)0x0;
  printf("test count = %i\n",(ulong)(uint)count);
  if (2 < argc) {
    pcVar46 = argv[2];
  }
  seed16[0] = '\0';
  seed16[1] = '\0';
  seed16[2] = '\0';
  seed16[3] = '\0';
  seed16[4] = '\0';
  seed16[5] = '\0';
  seed16[6] = '\0';
  seed16[7] = '\0';
  seed16[8] = '\0';
  seed16[9] = '\0';
  seed16[10] = '\0';
  seed16[0xb] = '\0';
  seed16[0xc] = '\0';
  seed16[0xd] = '\0';
  seed16[0xe] = '\0';
  seed16[0xf] = '\0';
  local_1b18 = (FILE *)(ulong)(uint)argc;
  local_19f8 = argv;
  if ((pcVar46 == (char *)0x0) || (*pcVar46 == '\0')) {
    __stream = fopen("/dev/urandom","rb");
    if (__stream == (FILE *)0x0) goto LAB_00114a33;
    sVar9 = fread(seed16,1,0x10,__stream);
    if (sVar9 != 0x10) goto LAB_00114a33;
    goto LAB_00111f07;
  }
  iVar44 = 0;
  while ((((iVar44 < 0x10 && (*pcVar46 != '\0')) && (pcVar46[1] != '\0')) &&
         (iVar4 = __isoc99_sscanf(pcVar46,"%2hx",groupj), iVar4 == 1))) {
    seed16[iVar44] = (uchar)groupj[0].x.n[0];
    pcVar46 = pcVar46 + 2;
    iVar44 = iVar44 + 1;
  }
LAB_00111f14:
  na_00 = (secp256k1_scratch *)((ulong)seed16._0_8_ >> 0x18 & 0xff);
  local_1ae8 = (secp256k1_ge *)((ulong)seed16._0_8_ >> 0x38);
  local_1ae0 = (secp256k1_ge *)(seed16._8_8_ & 0xff);
  local_1ad8 = (secp256k1_gej *)((ulong)seed16._8_8_ >> 8 & 0xff);
  lVar8 = 0;
  printf("random seed = %02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x\n",
         seed16._0_8_ & 0xff,(ulong)seed16._0_8_ >> 8 & 0xff);
  groupj[0].x.n[0] = 0xbb67ae856a09e667;
  groupj[0].x.n[1] = 0xa54ff53a3c6ef372;
  groupj[0].x.n[2] = 0x9b05688c510e527f;
  groupj[0].x.n[3] = 0x5be0cd191f83d9ab;
  groupj[0].z.n[0] = 0;
  secp256k1_sha256_write((secp256k1_sha256 *)groupj,(uchar *)"secp256k1 test init",0x13);
  secp256k1_sha256_write((secp256k1_sha256 *)groupj,seed16,0x10);
  psVar10 = group;
  secp256k1_sha256_finalize((secp256k1_sha256 *)groupj,(uchar *)psVar10);
  ppcVar17 = local_19f8;
  do {
    psVar22 = (secp256k1_fe *)0x0;
    uVar25 = 0;
    do {
      uVar25 = (ulong)*(byte *)((long)psVar22->n + (long)&psVar10->x) | uVar25 << 8;
      psVar22 = (secp256k1_fe *)((long)psVar22->n + 1);
    } while (psVar22 != (secp256k1_fe *)0x8);
    secp256k1_test_state[lVar8] = uVar25;
    lVar8 = lVar8 + 1;
    psVar10 = (secp256k1_ge *)((psVar10->x).n + 1);
  } while (lVar8 != 4);
  if (4 < (int)(uint)local_1b18) {
    lVar8 = strtol(local_19f8[3],(char **)0x0,0);
    num_cores = (uint32_t)lVar8;
    uVar25 = strtol(ppcVar17[4],(char **)0x0,0);
    this_core = (uint32_t)uVar25;
    if (((ulong)num_cores == 0) || (num_cores <= this_core)) {
LAB_00114a59:
      main_cold_2();
      return 1;
    }
    printf("running tests for core %lu (out of [0..%lu])\n",uVar25 & 0xffffffff,(ulong)num_cores - 1
          );
  }
  psVar39 = (secp256k1_context *)0xd0;
  psVar10 = (secp256k1_ge *)malloc(0xd0);
  if (psVar10 != (secp256k1_ge *)0x0) {
    psVar39 = (secp256k1_context *)0x130;
    psVar11 = (secp256k1_gej *)malloc(0x130);
    if (psVar11 != (secp256k1_gej *)0x0) {
      psVar39 = (secp256k1_context *)0x130;
      psVar12 = (secp256k1_gej *)malloc(0x130);
      if (psVar12 != (secp256k1_gej *)0x0) {
        secp256k1_scalar_verify(&secp256k1_scalar_one);
        seed16[0] = '\a';
        seed16[1] = '\0';
        seed16[2] = '\0';
        seed16[3] = '\0';
        secp256k1_scalar_verify((secp256k1_scalar *)seed16);
        secp256k1_gej_set_infinity(groupj);
        uVar31 = 0xff;
        do {
          secp256k1_gej_double_var(groupj,groupj,(secp256k1_fe *)0x0);
          secp256k1_scalar_verify((secp256k1_scalar *)seed16);
          bVar47 = (7U >> (uVar31 & 0x1f) & 1) != 0;
          psVar22 = (secp256k1_fe *)CONCAT71((int7)((ulong)psVar22 >> 8),bVar47);
          if ((uVar31 < 0x20) && (bVar47)) {
            psVar22 = (secp256k1_fe *)0x0;
            secp256k1_gej_add_ge_var(groupj,groupj,&secp256k1_ge_const_g,(secp256k1_fe *)0x0);
          }
          bVar47 = uVar31 != 0;
          uVar31 = uVar31 - 1;
        } while (bVar47);
        psVar39 = (secp256k1_context *)group;
        secp256k1_gej_double_var((secp256k1_gej *)psVar39,groupj,(secp256k1_fe *)0x0);
        iVar44 = secp256k1_gej_eq_ge_var((secp256k1_gej *)psVar39,&secp256k1_ge_const_g);
        if (iVar44 != 0) {
          secp256k1_gej_set_infinity((secp256k1_gej *)group);
          lVar8 = -0x98;
          do {
            secp256k1_gej_add_var((secp256k1_gej *)group,(secp256k1_gej *)group,groupj,psVar22);
            secp256k1_gej_double_var(groupj,groupj,(secp256k1_fe *)0x0);
            memcpy((void *)((long)psVar11[1].x.n + lVar8),groupj,0x98);
            if (lVar8 != 0) {
              secp256k1_gej_double_var(groupj,groupj,(secp256k1_fe *)0x0);
            }
            lVar8 = lVar8 + 0x98;
          } while (lVar8 == 0);
          secp256k1_gej_neg(psVar12,(secp256k1_gej *)group);
          secp256k1_gej_add_var(psVar12 + 1,psVar12,psVar11,psVar22);
          lVar8 = 0;
          do {
            secp256k1_gej_verify((secp256k1_gej *)((long)(psVar12->x).n + lVar8));
            lVar8 = lVar8 + 0x98;
          } while (lVar8 == 0x98);
          psVar22 = &psVar12->z;
          lVar8 = -1;
          lVar32 = 0;
          psVar33 = psVar10;
          do {
            if ((int)psVar22[1].n[0] == 0) {
              if (lVar8 == -1) {
                uVar41 = psVar22->n[0];
                uVar3 = psVar22->n[1];
                auVar49 = *(undefined1 (*) [16])(psVar22->n + 2);
                uVar5 = *(undefined4 *)((long)psVar22->n + 0x24);
                iVar44 = psVar22->magnitude;
                iVar4 = psVar22->normalized;
                *(int *)((psVar33->x).n + 4) = (int)psVar22->n[4];
                *(undefined4 *)((long)(psVar33->x).n + 0x24) = uVar5;
                (psVar33->x).magnitude = iVar44;
                (psVar33->x).normalized = iVar4;
                *(undefined1 (*) [16])((psVar33->x).n + 2) = auVar49;
                (psVar33->x).n[0] = uVar41;
                (psVar33->x).n[1] = uVar3;
                lVar8 = lVar32;
              }
              else {
                secp256k1_fe_mul(&psVar33->x,&psVar10[lVar8].x,psVar22);
                lVar8 = lVar32;
              }
            }
            else {
              secp256k1_ge_set_infinity(psVar33);
            }
            lVar32 = lVar32 + 1;
            psVar33 = psVar33 + 1;
            psVar22 = (secp256k1_fe *)(psVar22[3].n + 1);
          } while (lVar32 == 1);
          if (lVar8 != -1) {
            psVar39 = (secp256k1_context *)group;
            secp256k1_fe_inv_var((secp256k1_fe *)psVar39,&psVar10[lVar8].x);
            if ((lVar8 != 0) && (psVar12->infinity == 0)) {
              psVar39 = (secp256k1_context *)group;
              secp256k1_fe_mul(&psVar10[lVar8].x,(secp256k1_fe *)psVar10,(secp256k1_fe *)psVar39);
              secp256k1_fe_mul((secp256k1_fe *)psVar39,(secp256k1_fe *)psVar39,&psVar12[lVar8].z);
              lVar8 = 0;
            }
            if (psVar12[lVar8].infinity != 0) goto LAB_00114acf;
            psVar22 = &psVar10[lVar8].x;
            *(undefined4 *)(psVar22->n + 4) = (undefined4)group[0].x.n[4];
            *(undefined4 *)((long)psVar22->n + 0x24) = group[0].x.n[4]._4_4_;
            *(int *)(psVar22->n + 4 + 1) = group[0].x.magnitude;
            psVar22->normalized = group[0].x.normalized;
            *(undefined1 (*) [16])(psVar10[lVar8].x.n + 2) = group[0].x.n._16_16_;
            psVar10[lVar8].x.n[0] = group[0].x.n[0];
            psVar10[lVar8].x.n[1] = group[0].x.n[1];
            lVar8 = 0;
            a = psVar12;
            do {
              if (a->infinity == 0) {
                psVar33 = (secp256k1_ge *)((long)(psVar10->x).n + lVar8);
                secp256k1_ge_set_gej_zinv(psVar33,a,(secp256k1_fe *)psVar33);
              }
              lVar8 = lVar8 + 0x68;
              a = a + 1;
            } while (lVar8 == 0x68);
            lVar8 = 0;
            do {
              secp256k1_ge_verify((secp256k1_ge *)((long)(psVar10->x).n + lVar8));
              lVar8 = lVar8 + 0x68;
            } while (lVar8 == 0x68);
          }
          r = secp256k1_ecmult_gen_prec_table;
          lVar8 = 0;
          do {
            psVar39 = (secp256k1_context *)((long)(psVar10->x).n + lVar8);
            psVar13 = psVar39;
            secp256k1_ge_verify((secp256k1_ge *)psVar39);
            if (*(int *)((long)(&psVar10->y + 1) + lVar8) != 0) goto LAB_00114a70;
            secp256k1_ge_to_storage(*r,(secp256k1_ge *)psVar39);
            lVar8 = lVar8 + 0x68;
            r = (secp256k1_ge_storage (*) [2])((long)r + 0x40);
          } while (lVar8 == 0x68);
          free(psVar12);
          free(psVar11);
          free(psVar10);
          secp256k1_gej_set_ge(groupj,&secp256k1_ge_const_g);
          secp256k1_ecmult_compute_table(secp256k1_pre_g,(int)groupj,gen);
          iVar44 = 0x80;
          do {
            secp256k1_gej_double_var(groupj,groupj,(secp256k1_fe *)0x0);
            iVar44 = iVar44 + -1;
          } while (iVar44 != 0);
          secp256k1_ecmult_compute_table(secp256k1_pre_g_128,(int)groupj,gen_00);
          iVar44 = count;
joined_r0x0011246c:
          count = iVar44 + -1;
          if (iVar44 == 0) {
            testrand256(seed16);
            printf("random run = %02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x\n"
                   ,seed16._0_8_ & 0xff,(ulong)seed16._0_8_ >> 8 & 0xff,
                   (ulong)seed16._0_8_ >> 0x10 & 0xff,(ulong)seed16._0_8_ >> 0x18 & 0xff,
                   (ulong)seed16._0_8_ >> 0x20 & 0xff,(ulong)seed16._0_8_ >> 0x28 & 0xff,
                   (ulong)seed16._0_8_ >> 0x30 & 0xff,(ulong)seed16._0_8_ >> 0x38,
                   seed16._8_8_ & 0xff,(ulong)seed16._8_8_ >> 8 & 0xff,
                   (ulong)seed16._8_8_ >> 0x10 & 0xff,(ulong)seed16._8_8_ >> 0x18 & 0xff,
                   (ulong)seed16._8_8_ >> 0x20 & 0xff,(ulong)seed16._8_8_ >> 0x28 & 0xff,
                   (ulong)seed16._8_8_ >> 0x30 & 0xff,(ulong)seed16._8_8_ >> 0x38);
            puts("no problems found");
            return 0;
          }
          psVar13 = secp256k1_context_create(1);
          testrand256(rand32);
          psVar39 = psVar13;
          iVar44 = secp256k1_context_randomize(psVar13,rand32);
          if (iVar44 == 0) goto LAB_00114ad4;
          local_1af8 = psVar13;
          local_1a00 = psVar13;
          secp256k1_gej_set_infinity(groupj);
          secp256k1_ge_set_gej(group,groupj);
          iVar44 = 1;
          lVar8 = -0x4e0;
          psVar11 = groupj;
          do {
            psVar12 = psVar11 + 1;
            secp256k1_gej_add_ge(psVar12,psVar11,&secp256k1_ge_const_g);
            secp256k1_ge_set_gej((secp256k1_ge *)(auStack_7f0 + lVar8),psVar12);
            if (count != 0) {
              testutil_random_fe((secp256k1_fe *)seed16);
              secp256k1_gej_rescale(psVar12,(secp256k1_fe *)seed16);
            }
            scalar_i = iVar44;
            secp256k1_scalar_verify(&scalar_i);
            secp256k1_ecmult_gen(&local_1af8->ecmult_gen_ctx,(secp256k1_gej *)seed16,&scalar_i);
            psVar13 = (secp256k1_context *)&generated;
            secp256k1_ge_set_gej((secp256k1_ge *)psVar13,(secp256k1_gej *)seed16);
            if (*(int *)((long)groupj[0].y.n + lVar8 + 0x28) != 0) goto LAB_00114a75;
            if (generated.infinity != 0) goto LAB_00114a7a;
            psVar13 = (secp256k1_context *)&generated;
            iVar4 = secp256k1_fe_equal((secp256k1_fe *)psVar13,(secp256k1_fe *)(auStack_7f0 + lVar8)
                                      );
            if (iVar4 == 0) goto LAB_00114a7f;
            psVar13 = (secp256k1_context *)&generated.y;
            iVar4 = secp256k1_fe_equal((secp256k1_fe *)psVar13,
                                       (secp256k1_fe *)((long)groupj[0].x.n + lVar8 + 0x28));
            if (iVar4 == 0) goto LAB_00114a84;
            iVar44 = iVar44 + 1;
            lVar8 = lVar8 + 0x68;
            psVar11 = psVar12;
          } while (lVar8 != 0);
          uVar25 = 0;
          psVar10 = group;
          lVar8 = 0;
          do {
            psVar13 = (secp256k1_context *)(psVar10 + (uVar25 / 0xd) * -0xd);
            secp256k1_ge_mul_lambda
                      ((secp256k1_ge *)seed16,(secp256k1_ge *)((long)group[0].x.n + lVar8));
            iVar44 = secp256k1_ge_eq_var((secp256k1_ge *)psVar13,(secp256k1_ge *)seed16);
            if (iVar44 == 0) goto LAB_00114a89;
            lVar8 = lVar8 + 0x68;
            psVar10 = psVar10 + 9;
            uVar25 = uVar25 + 9;
          } while (lVar8 != 0x548);
          psVar39 = (secp256k1_context *)group;
          secp256k1_ge_verify((secp256k1_ge *)psVar39);
          if (group[0].infinity == 0) goto LAB_00114ad9;
          psVar39 = (secp256k1_context *)groupj;
          secp256k1_gej_verify((secp256k1_gej *)psVar39);
          if (groupj[0].infinity == 0) goto LAB_00114ade;
          lVar8 = 0xc;
          psVar10 = group;
          psVar11 = groupj;
          do {
            a_00 = (secp256k1_context *)(psVar11 + 1);
            psVar39 = (secp256k1_context *)(psVar10 + 1);
            psVar13 = psVar39;
            secp256k1_ge_verify((secp256k1_ge *)psVar39);
            if ((psVar39->ecmult_gen_ctx).ge_offset.y.magnitude != 0) goto LAB_00114a8e;
            psVar13 = a_00;
            secp256k1_gej_verify((secp256k1_gej *)a_00);
            if ((int)(a_00->ecmult_gen_ctx).proj_blind.n[4] != 0) goto LAB_00114a93;
            psVar11 = (secp256k1_gej *)&a_00->ecmult_gen_ctx;
            psVar10 = (secp256k1_ge *)&psVar39->ecmult_gen_ctx;
            lVar8 = lVar8 + -1;
          } while (lVar8 != 0);
          local_1ae8 = group;
          local_1b10 = 0;
          local_1ae0 = (secp256k1_ge *)0x0;
          do {
            bVar47 = true;
            if ((ulong)num_cores != 1) {
              local_1ae0 = (secp256k1_ge *)((long)local_1ae0[-0x3d813dfbfe4488].x.n + 0x1b);
              bVar47 = (uint32_t)
                       (((ulong)local_1ae0 >> 0x20 ^ (ulong)local_1ae0 & 0xffffffff) *
                        (ulong)num_cores >> 0x20) == this_core;
            }
            if (bVar47) {
              secp256k1_fe_inv((secp256k1_fe *)&scalar_i,&groupj[local_1b10].z);
              lVar8 = 0;
              psVar10 = local_1ae8;
              uVar25 = local_1b10;
              do {
                psVar33 = psVar10 + (uVar25 / 0xd) * -0xd;
                psVar11 = (secp256k1_gej *)((long)groupj[0].x.n + lVar8);
                secp256k1_gej_add_var
                          ((secp256k1_gej *)seed16,psVar11,groupj + local_1b10,
                           (secp256k1_fe *)0x4ec4ec4ec4ec4ec5);
                iVar44 = secp256k1_gej_eq_ge_var((secp256k1_gej *)seed16,psVar33);
                if (iVar44 == 0) {
                  main_cold_64();
LAB_00114a4a:
                  main_cold_63();
LAB_00114a4f:
                  main_cold_62();
LAB_00114a54:
                  main_cold_9();
                  goto LAB_00114a59;
                }
                if (local_1b10 != 0) {
                  secp256k1_gej_add_ge((secp256k1_gej *)seed16,psVar11,group + local_1b10);
                  iVar44 = secp256k1_gej_eq_ge_var((secp256k1_gej *)seed16,psVar33);
                  if (iVar44 != 0) goto LAB_0011289f;
                  goto LAB_00114a54;
                }
LAB_0011289f:
                secp256k1_gej_add_ge_var
                          ((secp256k1_gej *)seed16,psVar11,group + local_1b10,(secp256k1_fe *)0x0);
                iVar44 = secp256k1_gej_eq_ge_var((secp256k1_gej *)seed16,psVar33);
                if (iVar44 == 0) goto LAB_00114a4a;
                generated.infinity = groupj[local_1b10].infinity;
                generated.x.n[4] = groupj[local_1b10].x.n[4];
                generated.x.magnitude = groupj[local_1b10].x.magnitude;
                generated.x.normalized = groupj[local_1b10].x.normalized;
                generated.x.n[3] = groupj[local_1b10].x.n[3];
                generated.x.n[2] = groupj[local_1b10].x.n[2];
                generated.x.n[1] = groupj[local_1b10].x.n[1];
                generated.x.n[0] = groupj[local_1b10].x.n[0];
                generated.y.n[0] = groupj[local_1b10].y.n[0];
                generated.y.n[1] = groupj[local_1b10].y.n[1];
                generated.y.n._16_16_ = *(undefined1 (*) [16])(groupj[local_1b10].y.n + 2);
                generated.y.n[4]._0_4_ = (undefined4)groupj[local_1b10].y.n[4];
                generated.y.n[4]._4_4_ = *(undefined4 *)((long)groupj[local_1b10].y.n + 0x24);
                generated.y.magnitude = groupj[local_1b10].y.magnitude;
                generated.y.normalized = groupj[local_1b10].y.normalized;
                secp256k1_gej_add_zinv_var
                          ((secp256k1_gej *)seed16,psVar11,&generated,(secp256k1_fe *)&scalar_i);
                iVar44 = secp256k1_gej_eq_ge_var((secp256k1_gej *)seed16,psVar33);
                if (iVar44 == 0) goto LAB_00114a4f;
                lVar8 = lVar8 + 0x98;
                psVar10 = psVar10 + 1;
                uVar25 = uVar25 + 1;
              } while (lVar8 != 0x7b8);
            }
            local_1b10 = local_1b10 + 1;
            local_1ae8 = local_1ae8 + 1;
          } while (local_1b10 != 0xd);
          uVar25 = 0;
          psVar10 = group;
          lVar8 = 0;
          do {
            psVar11 = (secp256k1_gej *)((long)groupj[0].x.n + lVar8);
            psVar39 = (secp256k1_context *)seed16;
            secp256k1_gej_double((secp256k1_gej *)psVar39,psVar11);
            psVar13 = psVar39;
            iVar44 = secp256k1_gej_eq_ge_var
                               ((secp256k1_gej *)psVar39,psVar10 + (uVar25 / 0xd) * -0xd);
            if (iVar44 == 0) goto LAB_00114a9d;
            secp256k1_gej_double_var((secp256k1_gej *)psVar39,psVar11,(secp256k1_fe *)0x0);
            iVar44 = secp256k1_gej_eq_ge_var
                               ((secp256k1_gej *)psVar39,psVar10 + (uVar25 / 0xd) * -0xd);
            if (iVar44 == 0) goto LAB_00114aa2;
            lVar8 = lVar8 + 0x98;
            psVar10 = psVar10 + 2;
            uVar25 = uVar25 + 2;
          } while (lVar8 != 0x7b8);
          lVar8 = 0x68;
          psVar10 = group + 0xc;
          psVar11 = groupj;
          do {
            psVar11 = psVar11 + 1;
            psVar39 = (secp256k1_context *)&generated;
            secp256k1_ge_neg((secp256k1_ge *)psVar39,(secp256k1_ge *)((long)group[0].x.n + lVar8));
            iVar44 = secp256k1_ge_eq_var((secp256k1_ge *)psVar39,psVar10);
            if (iVar44 == 0) goto LAB_00114aa7;
            secp256k1_gej_neg((secp256k1_gej *)seed16,psVar11);
            psVar39 = (secp256k1_context *)seed16;
            iVar44 = secp256k1_gej_eq_ge_var((secp256k1_gej *)seed16,psVar10);
            if (iVar44 == 0) goto LAB_00114aac;
            lVar8 = lVar8 + 0x68;
            psVar10 = psVar10 + -1;
          } while (lVar8 != 0x548);
          psVar10 = (secp256k1_ge *)0x1;
          local_1b08 = 0x68;
          local_1ad8 = (secp256k1_gej *)0x0;
LAB_00112ac6:
          psVar11 = groupj + (long)psVar10;
          local_1b18 = (FILE *)0x0;
          local_1ae0 = group;
          local_1ae8 = psVar10;
          while( true ) {
            bVar47 = true;
            if ((ulong)num_cores != 1) {
              local_1ad8 = (secp256k1_gej *)((long)local_1ad8[-0x2a150f76858d35].y.n + 0x23);
              bVar47 = (uint32_t)
                       (((ulong)local_1ad8 >> 0x20 ^ (ulong)local_1ad8 & 0xffffffff) *
                        (ulong)num_cores >> 0x20) == this_core;
            }
            if (bVar47) break;
LAB_00112c17:
            local_1b18 = (FILE *)((long)&local_1b18->_flags + 1);
            local_1ae0 = local_1ae0 + 1;
            if ((int)local_1b18 == 0xd) goto code_r0x00112c31;
          }
          iVar44 = 0;
          psVar33 = local_1ae0;
          __stream = local_1b18;
          while( true ) {
            na = iVar44;
            secp256k1_scalar_verify(&na);
            ng = (int)local_1b18;
            secp256k1_scalar_verify(&ng);
            psStack_1aa0 = &generated;
            _ng_1 = (secp256k1_fe *)&scalar_i;
            local_1a98._0_8_ = seed16;
            na_00 = (secp256k1_scratch *)&na;
            secp256k1_ecmult_strauss_wnaf
                      ((secp256k1_strauss_state *)&ng_1,&tmp_3,1,psVar11,(secp256k1_scalar *)na_00,
                       &ng);
            iVar4 = secp256k1_gej_eq_ge_var(&tmp_3,psVar33 + ((ulong)__stream / 0xd) * -0xd);
            if (iVar4 == 0) break;
            iVar44 = iVar44 + 1;
            psVar33 = (secp256k1_ge *)((long)(psVar33->x).n + local_1b08);
            __stream = (FILE *)((long)(local_1ae8->x).n + (long)&__stream->_flags);
            psVar10 = local_1ae8;
            if (iVar44 == 0xd) goto LAB_00112c17;
          }
          main_cold_57();
LAB_00114a33:
          main_cold_1();
LAB_00111f07:
          if (__stream != (FILE *)0x0) {
            fclose(__stream);
          }
          goto LAB_00111f14;
        }
        goto LAB_00114aca;
      }
      goto LAB_00114aed;
    }
    goto LAB_00114ae8;
  }
LAB_00114ae3:
  main_cold_74();
LAB_00114ae8:
  main_cold_73();
LAB_00114aed:
  main_cold_72();
LAB_00114af2:
  main_cold_11();
LAB_00114af7:
  main_cold_12();
LAB_00114afc:
  main_cold_13();
LAB_00114b01:
  main_cold_14();
LAB_00114b06:
  main_cold_10();
LAB_00114b0b:
  main_cold_15();
LAB_00114b10:
  main_cold_16();
LAB_00114b15:
  main_cold_49();
LAB_00114b1a:
  main_cold_17();
LAB_00114b1f:
  main_cold_18();
LAB_00114b24:
  main_cold_19();
LAB_00114b29:
  main_cold_20();
LAB_00114b2e:
  main_cold_21();
LAB_00114b33:
  main_cold_48();
LAB_00114b38:
  main_cold_47();
LAB_00114b3d:
  main_cold_46();
LAB_00114b42:
  main_cold_45();
LAB_00114b47:
  main_cold_44();
LAB_00114b4c:
  main_cold_43();
LAB_00114b51:
  main_cold_22();
LAB_00114b56:
  main_cold_42();
LAB_00114b5b:
  main_cold_23();
LAB_00114b60:
  main_cold_41();
LAB_00114b65:
  main_cold_24();
LAB_00114b6a:
  main_cold_40();
LAB_00114b6f:
  main_cold_39();
LAB_00114b74:
  main_cold_25();
LAB_00114b79:
  main_cold_26();
LAB_00114b7e:
  main_cold_27();
LAB_00114b83:
  main_cold_28();
LAB_00114b88:
  main_cold_38();
LAB_00114b8d:
  main_cold_37();
LAB_00114b92:
  main_cold_36();
LAB_00114b97:
  main_cold_35();
LAB_00114b9c:
  main_cold_29();
LAB_00114ba1:
  main_cold_30();
LAB_00114ba6:
  main_cold_31();
LAB_00114bab:
  main_cold_32();
LAB_00114bb0:
  main_cold_34();
LAB_00114bb5:
  main_cold_33();
  lVar8 = 0;
  do {
    uVar41 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
             secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0];
    uVar16 = secp256k1_test_state[1] << 0x11;
    uVar38 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
    uVar25 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
    secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar38;
    secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar25;
    secp256k1_test_state[3] = uVar25 << 0x2d | uVar25 >> 0x13;
    secp256k1_test_state[2] = uVar38 ^ uVar16;
    (psVar39->ecmult_gen_ctx).ge_offset.x.n[lVar8 + -1] = uVar41;
    lVar8 = lVar8 + 1;
  } while ((int)lVar8 != 4);
  return (int)secp256k1_test_state[0];
code_r0x00112c31:
  psVar10 = (secp256k1_ge *)((long)(psVar10->x).n + 1);
  local_1b08 = local_1b08 + 0x68;
  if (psVar10 == (secp256k1_ge *)0xd) goto code_r0x00112c44;
  goto LAB_00112ac6;
code_r0x00112c44:
  lVar8 = 0;
  do {
    lVar32 = 0;
    do {
      bVar47 = true;
      if ((ulong)num_cores != 1) {
        local_1ad8 = (secp256k1_gej *)((long)local_1ad8[-0x2a150f76858d35].y.n + 0x23);
        bVar47 = (uint32_t)
                 (((ulong)local_1ad8 >> 0x20 ^ (ulong)local_1ad8 & 0xffffffff) * (ulong)num_cores >>
                 0x20) == this_core;
      }
      if (bVar47) {
        ng_1 = (int)lVar8;
        secp256k1_scalar_verify(&ng_1);
        psVar10 = group + lVar32;
        psVar39 = (secp256k1_context *)seed16;
        secp256k1_ecmult_const((secp256k1_gej *)psVar39,psVar10,&ng_1);
        uVar31 = (int)lVar32 * (int)lVar8;
        psVar33 = group + (uVar31 - (uVar31 / 0xd + (uVar31 / 0xd) * 0xc));
        iVar44 = secp256k1_gej_eq_ge_var((secp256k1_gej *)psVar39,psVar33);
        if (iVar44 == 0) goto LAB_00114ab1;
        if (lVar32 != 0 && lVar8 != 0) {
          psVar13 = (secp256k1_context *)&tmp_3;
          psVar39 = psVar13;
          iVar44 = secp256k1_ecmult_const_xonly
                             ((secp256k1_fe *)psVar13,&psVar10->x,(secp256k1_fe *)0x0,&ng_1,0);
          if (iVar44 == 0) goto LAB_00114ab6;
          iVar44 = secp256k1_fe_equal((secp256k1_fe *)psVar13,&psVar33->x);
          if (iVar44 == 0) goto LAB_00114abb;
          do {
            psVar13 = (secp256k1_context *)&scalar_i;
            testutil_random_fe((secp256k1_fe *)psVar13);
            secp256k1_fe_verify((secp256k1_fe *)psVar13);
            if (iStack_178c == 0) {
              main_cold_53();
              goto LAB_00114a70;
            }
          } while ((SUB168(local_17a8 | _scalar_i,8) == 0 && SUB168(local_17a8 | _scalar_i,0) == 0)
                   && CONCAT44(auStack_1794,local_1798) == 0);
          secp256k1_fe_mul(&generated.x,(secp256k1_fe *)&scalar_i,&psVar10->x);
          psVar39 = (secp256k1_context *)&tmp_3;
          na_00 = (secp256k1_scratch *)0x0;
          psVar13 = psVar39;
          iVar44 = secp256k1_ecmult_const_xonly
                             ((secp256k1_fe *)psVar39,&generated.x,(secp256k1_fe *)&scalar_i,&ng_1,0
                             );
          if (iVar44 == 0) goto LAB_00114ac0;
          iVar44 = secp256k1_fe_equal((secp256k1_fe *)psVar39,&psVar33->x);
          if (iVar44 == 0) goto LAB_00114ac5;
        }
      }
      lVar32 = lVar32 + 1;
    } while (lVar32 != 0xd);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0xd);
  psVar14 = (secp256k1_scratch *)malloc(0x1020);
  if (psVar14 == (secp256k1_scratch *)0x0) {
    (*(local_1af8->error_callback).fn)("Out of memory",(local_1af8->error_callback).data);
  }
  else {
    psVar14->magic[0] = '\0';
    psVar14->magic[1] = '\0';
    psVar14->magic[2] = '\0';
    psVar14->magic[3] = '\0';
    psVar14->magic[4] = '\0';
    psVar14->magic[5] = '\0';
    psVar14->magic[6] = '\0';
    psVar14->magic[7] = '\0';
    psVar14->data = (void *)0x0;
    psVar14->alloc_size = 0;
    psVar14->max_size = 0;
    builtin_memcpy(psVar14->magic,"scratch",8);
    psVar14->data = psVar14 + 1;
    psVar14->max_size = 0x1000;
  }
  local_1a00 = (secp256k1_context *)&local_1a00->error_callback;
  local_19f0 = 0;
  local_19a0 = 0;
  local_1980 = psVar14;
  do {
    local_19e0 = 0;
    do {
      local_19e8 = 0;
      do {
        local_19b0 = 0;
        do {
          uVar25 = (ulong)num_cores;
          bVar47 = true;
          if (uVar25 != 1) {
            local_19a0 = local_19a0 + 0xe7037ed1a0b428db;
            bVar47 = (uint32_t)((local_19a0 >> 0x20 ^ local_19a0 & 0xffffffff) * uVar25 >> 0x20) ==
                     this_core;
          }
          if (bVar47) {
            local_1990 = group + local_19b0;
            local_1998 = (_func_void_char_ptr_void_ptr *)(local_19b0 * local_19f0 + local_19e8);
            p_Var29 = (_func_void_char_ptr_void_ptr *)0x0;
            do {
              uVar5 = (undefined4)local_19f0;
              seed16[0] = (char)uVar5;
              seed16[1] = (char)((uint)uVar5 >> 8);
              seed16[2] = (char)((uint)uVar5 >> 0x10);
              seed16[3] = (char)((uint)uVar5 >> 0x18);
              secp256k1_scalar_verify((secp256k1_scalar *)seed16);
              uVar5 = (undefined4)local_19e0;
              seed16[4] = (char)uVar5;
              seed16[5] = (char)((uint)uVar5 >> 8);
              seed16[6] = (char)((uint)uVar5 >> 0x10);
              seed16[7] = (char)((uint)uVar5 >> 0x18);
              secp256k1_scalar_verify((secp256k1_scalar *)(seed16 + 4));
              na = (int)local_19e8;
              secp256k1_scalar_verify(&na);
              psVar10 = local_1990;
              puVar30 = (uint64_t *)(seed16 + 8);
              for (lVar8 = 0xd; lVar8 != 0; lVar8 = lVar8 + -1) {
                *puVar30 = (psVar10->x).n[0];
                psVar10 = (secp256k1_ge *)((long)psVar10 + (ulong)bVar48 * -0x10 + 8);
                puVar30 = puVar30 + (ulong)bVar48 * -2 + 1;
              }
              local_1988 = p_Var29;
              psVar10 = group + (long)p_Var29;
              puVar30 = local_1448;
              for (pvVar23 = (void *)0xd; pvVar23 != (void *)0x0;
                  pvVar23 = (void *)((long)pvVar23 + -1)) {
                *puVar30 = (psVar10->x).n[0];
                psVar10 = (secp256k1_ge *)((long)psVar10 + (ulong)bVar48 * -0x10 + 8);
                puVar30 = puVar30 + (ulong)bVar48 * -2 + 1;
              }
              secp256k1_gej_set_infinity((secp256k1_gej *)&scalar_i);
              if (psVar14 == (secp256k1_scratch *)0x0) {
LAB_001130d1:
                secp256k1_ecmult_multi_simple_var
                          ((secp256k1_gej *)&scalar_i,&na,(secp256k1_ecmult_multi_callback *)seed16,
                           pvVar23,(size_t)na_00);
              }
              else {
                sVar15 = secp256k1_scratch_max_allocation
                                   ((secp256k1_callback *)local_1a00,psVar14,6);
                pvVar23 = (void *)0x1;
                na_00 = (secp256k1_scratch *)&DAT_00122718;
                uVar25 = 0;
                do {
                  if (pvVar23 == (void *)0xd) break;
                  if (pvVar23 < (void *)0xd) {
                    uVar38 = *(ulong *)na_00->magic;
                  }
                  else {
                    uVar38 = 0;
                  }
                  bVar47 = false;
                  uVar16 = 0x7f / (ulong)((int)pvVar23 + 1);
                  uVar42 = (0x98L << ((byte)pvVar23 & 0x3f)) + uVar16 * 8 + 0x118;
                  if (uVar42 <= sVar15) {
                    uVar16 = (sVar15 - uVar42) / (uVar16 * 8 + 0x108);
                    bVar47 = uVar38 <= uVar16;
                    if (!bVar47) {
                      uVar38 = uVar16;
                    }
                    if (uVar25 < uVar38) {
                      uVar25 = uVar38;
                    }
                  }
                  na_00 = (secp256k1_scratch *)&na_00->data;
                  pvVar23 = (void *)((long)pvVar23 + 1);
                } while (bVar47);
                if (uVar25 == 0) goto LAB_001130d1;
                sVar15 = secp256k1_scratch_max_allocation
                                   ((secp256k1_callback *)local_1a00,psVar14,5);
                pvVar23 = (void *)(sVar15 - 0xe18);
                bVar47 = pvVar23 < (void *)0xfffffffffffff8f4;
                if (sVar15 < 0x70c) {
                  bVar47 = uVar25 != 1;
                }
                uVar25 = (ulong)bVar47 + 1;
                if (sVar15 < 0x70c) goto LAB_001130d1;
                local_1960 = (ulong)(pvVar23 < (void *)0xfffffffffffff8f4);
                local_1b10 = 2;
                local_1968 = (secp256k1_ge *)(2 - local_1960);
                psVar10 = (secp256k1_ge *)0x0;
                local_1978 = uVar25;
                do {
                  uVar38 = uVar25;
                  if (local_1b10 < uVar25) {
                    uVar38 = local_1b10;
                  }
                  lVar8 = (long)psVar10 << ((byte)local_1960 & 0x3f);
                  local_19f8 = (char **)&na;
                  if (psVar10 != (secp256k1_ge *)0x0) {
                    local_19f8 = (char **)0x0;
                  }
                  psVar11 = (secp256k1_gej *)0x0;
                  ppcVar17 = local_19f8;
                  do {
                    ppcVar26 = (char **)((ulong)ppcVar17 & 0xffffffff);
                    bVar1 = psVar14->magic[(long)(psVar11->x).n];
                    bVar2 = *(byte *)((long)psVar11[0x1e77].y.n + 0x21);
                    ppcVar17 = (char **)(ulong)((uint)bVar1 - (uint)bVar2);
                    if (bVar1 == bVar2) {
                      ppcVar17 = ppcVar26;
                    }
                    iVar44 = (int)ppcVar17;
                    if (bVar1 != bVar2) goto LAB_001131e5;
                    psVar11 = (secp256k1_gej *)((long)(psVar11->x).n + 1);
                  } while (psVar11 != (secp256k1_gej *)0x8);
                  iVar44 = 0;
LAB_001131e5:
                  if (iVar44 == 0) {
                    local_1ae0 = (secp256k1_ge *)psVar14->alloc_size;
                  }
                  else {
                    (*(local_1af8->error_callback).fn)
                              ("invalid scratch space",(local_1af8->error_callback).data);
                    local_1ae0 = (secp256k1_ge *)0x0;
                  }
                  local_1ae8 = psVar10;
                  secp256k1_gej_set_infinity((secp256k1_gej *)&generated);
                  psVar39 = local_1a00;
                  if (local_1b10 == 0 && psVar10 != (secp256k1_ge *)0x0) {
                    cVar43 = '\0';
                  }
                  else {
                    local_1ad8 = (secp256k1_gej *)
                                 secp256k1_scratch_alloc
                                           ((secp256k1_callback *)local_1a00,psVar14,uVar38 * 0x98);
                    local_1970 = (secp256k1_scratch *)
                                 secp256k1_scratch_alloc
                                           ((secp256k1_callback *)psVar39,psVar14,uVar38 * 4);
                    pvVar23 = secp256k1_scratch_alloc
                                        ((secp256k1_callback *)psVar39,psVar14,uVar38 * 0xc0);
                    _ng_1 = (secp256k1_fe *)pvVar23;
                    pvVar18 = secp256k1_scratch_alloc
                                        ((secp256k1_callback *)psVar39,psVar14,uVar38 * 0x1a0);
                    psStack_1aa0 = (secp256k1_ge *)pvVar18;
                    pvVar19 = secp256k1_scratch_alloc
                                        ((secp256k1_callback *)psVar39,psVar14,uVar38 * 0x410);
                    psVar14 = local_1970;
                    local_1a98._0_8_ = pvVar19;
                    auVar49._0_4_ =
                         -(uint)((int)local_1ad8 == 0 && (int)((ulong)local_1ad8 >> 0x20) == 0);
                    auVar49._4_4_ =
                         -(uint)((int)local_1970 == 0 && (int)((ulong)local_1970 >> 0x20) == 0);
                    auVar49._8_4_ = -(uint)((int)pvVar23 == 0 && (int)((ulong)pvVar23 >> 0x20) == 0)
                    ;
                    auVar49._12_4_ =
                         -(uint)((int)pvVar18 == 0 && (int)((ulong)pvVar18 >> 0x20) == 0);
                    iVar44 = movmskps((int)psVar11,auVar49);
                    psVar11 = (secp256k1_gej *)
                              CONCAT71((int7)(CONCAT44((int)((ulong)psVar11 >> 0x20),iVar44) >> 8),
                                       iVar44 != 0 || pvVar19 == (void *)0x0);
                    local_19a4 = (int)psVar11;
                    if (iVar44 == 0 && pvVar19 != (void *)0x0) {
                      if (local_1b10 != 0) {
                        puVar30 = (uint64_t *)(seed16 + lVar8 * 0x68 + 8);
                        sVar15 = 0;
                        psVar11 = local_1ad8;
                        do {
                          *(undefined4 *)(psVar14->magic + sVar15 * 4) =
                               *(undefined4 *)(seed16 + sVar15 * 4 + lVar8 * 4);
                          puVar36 = puVar30;
                          psVar12 = &tmp_3;
                          for (lVar32 = 0xd; lVar32 != 0; lVar32 = lVar32 + -1) {
                            (psVar12->x).n[0] = *puVar36;
                            puVar36 = puVar36 + (ulong)bVar48 * -2 + 1;
                            psVar12 = (secp256k1_gej *)((long)psVar12 + (ulong)bVar48 * -0x10 + 8);
                          }
                          secp256k1_gej_set_ge(psVar11,(secp256k1_ge *)&tmp_3);
                          sVar15 = sVar15 + 1;
                          psVar11 = psVar11 + 1;
                          puVar30 = puVar30 + 0xd;
                        } while (uVar38 != sVar15);
                      }
                      psVar11 = local_1ad8;
                      secp256k1_ecmult_strauss_wnaf
                                ((secp256k1_strauss_state *)&ng_1,(secp256k1_gej *)&generated,uVar38
                                 ,local_1ad8,(secp256k1_scalar *)psVar14,
                                 (secp256k1_scalar *)local_19f8);
                      na_00 = psVar14;
                    }
                    psVar14 = local_1980;
                    secp256k1_scratch_apply_checkpoint
                              ((secp256k1_callback *)local_1a00,local_1980,(size_t)local_1ae0);
                    cVar43 = (char)local_19a4;
                    uVar25 = local_1978;
                  }
                  psVar10 = local_1ae8;
                  if (cVar43 == '\0') {
                    secp256k1_gej_add_var
                              ((secp256k1_gej *)&scalar_i,(secp256k1_gej *)&scalar_i,
                               (secp256k1_gej *)&generated,&psVar11->x);
                    local_1b10 = local_1b10 - uVar38;
                  }
                  psVar10 = (secp256k1_ge *)((long)(psVar10->x).n + 1);
                } while (cVar43 == '\0' && psVar10 != local_1968);
              }
              p_Var29 = local_1988;
              uVar31 = (int)local_1988 * (int)local_19e0 + (int)local_1998;
              psVar13 = (secp256k1_context *)&scalar_i;
              uVar31 = secp256k1_gej_eq_ge_var
                                 ((secp256k1_gej *)psVar13,
                                  group + (uVar31 - (uVar31 / 0xd + (uVar31 / 0xd) * 0xc)));
              uVar25 = (ulong)uVar31;
              if (uVar31 == 0) goto LAB_00114a98;
              p_Var29 = p_Var29 + 1;
            } while (p_Var29 != (_func_void_char_ptr_void_ptr *)0xd);
          }
          local_19b0 = local_19b0 + 1;
        } while (local_19b0 != 0xd);
        local_19e8 = local_19e8 + 1;
      } while (local_19e8 != 0xd);
      local_19e0 = local_19e0 + 1;
    } while (local_19e0 != 0xd);
    local_19f0 = local_19f0 + 1;
  } while (local_19f0 != 0xd);
  if (psVar14 != (secp256k1_scratch *)0x0) {
    lVar8 = 0;
    do {
      bVar1 = psVar14->magic[lVar8];
      bVar2 = "scratch"[lVar8];
      psVar39 = (secp256k1_context *)(ulong)bVar2;
      uVar38 = (ulong)((uint)bVar1 - (uint)bVar2);
      if (bVar1 == bVar2) {
        uVar38 = uVar25;
      }
      iVar44 = (int)uVar38;
      if (bVar1 != bVar2) goto LAB_001134f6;
      lVar8 = lVar8 + 1;
      uVar25 = uVar38;
    } while (lVar8 != 8);
    iVar44 = 0;
LAB_001134f6:
    if (iVar44 == 0) {
      if (psVar14->alloc_size != 0) goto LAB_00114b06;
      psVar14->magic[0] = '\0';
      psVar14->magic[1] = '\0';
      psVar14->magic[2] = '\0';
      psVar14->magic[3] = '\0';
      psVar14->magic[4] = '\0';
      psVar14->magic[5] = '\0';
      psVar14->magic[6] = '\0';
      psVar14->magic[7] = '\0';
      free(psVar14);
      na_00 = psVar14;
    }
    else {
      (*(local_1af8->error_callback).fn)("invalid scratch space",(local_1af8->error_callback).data);
      na_00 = psVar14;
    }
  }
  iVar44 = 1;
  local_1b18 = (FILE *)0x0;
  do {
    iVar4 = 1;
    do {
      bVar47 = true;
      if ((ulong)num_cores != 1) {
        local_1b18 = (FILE *)((long)local_1b18 + 0xe7037ed1a0b428db);
        bVar47 = (uint32_t)
                 (((ulong)local_1b18 >> 0x20 ^ (ulong)local_1b18 & 0xffffffff) * (ulong)num_cores >>
                 0x20) == this_core;
      }
      if (bVar47) {
        tmp_3.x.n[0]._0_4_ = 1;
        iVar27 = 1;
        do {
          na = iVar44;
          secp256k1_scalar_verify(&na);
          ng_1 = iVar4;
          secp256k1_scalar_verify(&ng_1);
          secp256k1_scalar_verify(&ng_1);
          generated.x.n[0] = 0;
          generated.x.n[1] = 0;
          generated.x.n._16_15_ = SUB1615((undefined1  [16])0x0,0);
          generated.x.n[3]._7_1_ = (char)iVar4;
          secp256k1_scalar_verify(&na);
          _scalar_i = (undefined1  [16])0x0;
          local_17a8._0_15_ = SUB1615((undefined1  [16])0x0,0);
          local_17a8[0xf] = (char)iVar44;
          psVar39 = local_1af8;
          iVar6 = secp256k1_ecdsa_sign
                            (local_1af8,(secp256k1_ecdsa_signature *)seed16,(uchar *)&scalar_i,
                             (uchar *)&generated,secp256k1_nonce_function_smallint,&tmp_3);
          if (iVar6 != 1) goto LAB_00114af2;
          secp256k1_scalar_set_b32(&ng,seed16,(int *)0x0);
          secp256k1_scalar_set_b32(&s,local_1498,(int *)0x0);
          psVar39 = (secp256k1_context *)&expected_r;
          r_from_k((secp256k1_scalar *)psVar39,group,(int)tmp_3.x.n[0],(int *)0x0);
          if (ng != expected_r) goto LAB_00114af7;
          iVar6 = (int)tmp_3.x.n[0];
          uVar35 = s * (int)tmp_3.x.n[0];
          uVar31 = ng * iVar4 + iVar44;
          na_00 = (secp256k1_scratch *)(ulong)((uVar31 / 0xd) * 3);
          iVar21 = uVar31 - (uVar31 / 0xd + (uVar31 / 0xd) * 0xc);
          if (uVar35 - (uVar35 / 0xd + (uVar35 / 0xd) * 0xc) != iVar21) {
            uVar31 = (0xd - s) * (int)tmp_3.x.n[0];
            psVar39 = (secp256k1_context *)(ulong)((uVar31 / 0xd) * 3);
            if (uVar31 - (uVar31 / 0xd + (uVar31 / 0xd) * 0xc) != iVar21) goto LAB_00114afc;
          }
          if ((int)tmp_3.x.n[0] < iVar27) break;
          iVar27 = (int)tmp_3.x.n[0] + 1;
          tmp_3.x.n[0]._0_4_ = iVar27;
        } while (iVar6 < 0xc);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 != 0xd);
    iVar44 = iVar44 + 1;
  } while (iVar44 != 0xd);
  local_1b10._0_4_ = 1;
  local_1b08 = 0;
  do {
    iVar44 = 1;
    do {
      iVar4 = 1;
      do {
        psVar10 = (secp256k1_ge *)0x1;
        do {
          bVar47 = true;
          if ((ulong)num_cores != 1) {
            local_1b08 = local_1b08 + 0xe7037ed1a0b428db;
            bVar47 = (uint32_t)
                     ((local_1b08 >> 0x20 ^ local_1b08 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
                     this_core;
          }
          if (bVar47) {
            s = (uint)local_1b10;
            secp256k1_scalar_verify(&s);
            ng = iVar44;
            secp256k1_scalar_verify(&ng);
            na = iVar4;
            secp256k1_scalar_verify(&na);
            ng_1 = (int)psVar10;
            local_1ae8 = psVar10;
            secp256k1_scalar_verify(&ng_1);
            uVar31 = 0;
            iVar27 = 0;
            do {
              r_from_k((secp256k1_scalar *)seed16,group,iVar27,(int *)0x0);
              if (iVar44 == seed16._0_4_) {
                _expected_r = CONCAT44(sStack_1ac4,iVar27);
                secp256k1_scalar_verify(&expected_r);
                secp256k1_scalar_mul(&expected_r,&expected_r,&s);
                secp256k1_scalar_mul(&msg_plus_r_times_sk_s,&ng,&ng_1);
                secp256k1_scalar_add(&msg_plus_r_times_sk_s,&msg_plus_r_times_sk_s,&na);
                secp256k1_scalar_verify(&expected_r);
                secp256k1_scalar_verify(&msg_plus_r_times_sk_s);
                uVar31 = uVar31 | expected_r == msg_plus_r_times_sk_s;
              }
              iVar27 = iVar27 + 1;
            } while (iVar27 != 0xd);
            secp256k1_scalar_verify(&s);
            secp256k1_ecdsa_signature_save((secp256k1_ecdsa_signature *)&generated,&ng,&s);
            psVar10 = local_1ae8;
            psVar33 = group + (long)local_1ae8;
            psVar40 = (secp256k1_ge *)seed16;
            for (lVar8 = 0xd; lVar8 != 0; lVar8 = lVar8 + -1) {
              (psVar40->x).n[0] = (psVar33->x).n[0];
              psVar33 = (secp256k1_ge *)((long)psVar33 + (ulong)bVar48 * -0x10 + 8);
              psVar40 = (secp256k1_ge *)((long)psVar40 + (ulong)bVar48 * -0x10 + 8);
            }
            secp256k1_pubkey_save((secp256k1_pubkey *)&scalar_i,(secp256k1_ge *)seed16);
            secp256k1_scalar_verify(&na);
            tmp_3.x.n[0] = 0;
            tmp_3.x.n[1] = 0;
            tmp_3.x.n._16_15_ = SUB1615((undefined1  [16])0x0,0);
            tmp_3.x.n[3]._7_1_ = (char)iVar4;
            psVar39 = local_1af8;
            uVar35 = secp256k1_ecdsa_verify
                               (local_1af8,(secp256k1_ecdsa_signature *)&generated,(uchar *)&tmp_3,
                                (secp256k1_pubkey *)&scalar_i);
            if (((uint)local_1b10 < 7 & uVar31) != uVar35) goto LAB_00114b01;
          }
          psVar10 = (secp256k1_ge *)((long)(psVar10->x).n + 1);
        } while (psVar10 != (secp256k1_ge *)0xd);
        iVar4 = iVar4 + 1;
      } while (iVar4 != 0xd);
      iVar44 = iVar44 + 1;
    } while (iVar44 != 0xd);
    local_1b10._0_4_ = (uint)local_1b10 + 1;
  } while ((uint)local_1b10 != 0xd);
  iVar44 = 1;
  local_1b08 = 0;
  do {
    iVar4 = 1;
    do {
      bVar47 = true;
      if ((ulong)num_cores != 1) {
        local_1b08 = local_1b08 + 0xe7037ed1a0b428db;
        bVar47 = (uint32_t)
                 ((local_1b08 >> 0x20 ^ local_1b08 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
                 this_core;
      }
      if (bVar47) {
        na = 1;
        iVar27 = 1;
        do {
          s = iVar44;
          secp256k1_scalar_verify(&s);
          ng = iVar4;
          secp256k1_scalar_verify(&ng);
          secp256k1_scalar_verify(&ng);
          tmp_3.x.n[0] = 0;
          tmp_3.x.n[1] = 0;
          tmp_3.x.n._16_15_ = SUB1615((undefined1  [16])0x0,0);
          tmp_3.x.n[3]._7_1_ = (char)iVar4;
          secp256k1_scalar_verify(&s);
          _ng_1 = (undefined1  [16])0x0;
          local_1a98._0_15_ = SUB1615((undefined1  [16])0x0,0);
          local_1a98[0xf] = (char)iVar44;
          secp256k1_ecdsa_sign_recoverable
                    (local_1af8,(secp256k1_ecdsa_recoverable_signature *)seed16,(uchar *)&ng_1,
                     (uchar *)&tmp_3,secp256k1_nonce_function_smallint,&na);
          secp256k1_scalar_set_b32(&expected_r,seed16,(int *)0x0);
          secp256k1_scalar_set_b32(&msg_plus_r_times_sk_s,local_1498,(int *)0x0);
          bVar1 = local_1478;
          psVar39 = (secp256k1_context *)&expected_r_1;
          r_from_k((secp256k1_scalar *)psVar39,group,na,(int *)&expected_s);
          sVar28 = msg_plus_r_times_sk_s;
          if (expected_r != expected_r_1) goto LAB_00114b0b;
          lVar8 = (long)(int)na;
          uVar31 = msg_plus_r_times_sk_s * na;
          uVar35 = expected_r * iVar4 + iVar44;
          iVar6 = uVar35 - (uVar35 / 0xd + (uVar35 / 0xd) * 0xc);
          if ((uVar31 - (uVar31 / 0xd + (uVar31 / 0xd) * 0xc) != iVar6) &&
             (uVar31 = (0xd - msg_plus_r_times_sk_s) * na,
             uVar31 - (uVar31 / 0xd + (uVar31 / 0xd) * 0xc) != iVar6)) goto LAB_00114b10;
          uVar31 = (uint)(expected_s != 0) * 2;
          local_1798 = *(uchar (*) [4])(group[lVar8].y.n + 4);
          auStack_1794 = *(uchar (*) [4])((long)group[lVar8].y.n + 0x24);
          iStack_1790 = group[lVar8].y.magnitude;
          iStack_178c = group[lVar8].y.normalized;
          uStack_17b0 = group[lVar8].y.n[1];
          _scalar_i = group[lVar8].y.n[0];
          local_17a8._8_8_ = group[lVar8].y.n[3];
          local_17a8._0_8_ = group[lVar8].y.n[2];
          psVar39 = (secp256k1_context *)&scalar_i;
          secp256k1_fe_normalize((secp256k1_fe *)psVar39);
          uVar35 = sVar28 * na;
          secp256k1_fe_verify((secp256k1_fe *)psVar39);
          if (uVar35 - (uVar35 / 0xd + (uVar35 / 0xd) * 0xc) == iVar6) {
            if (iStack_178c == 0) goto LAB_00114b15;
            uVar31 = scalar_i & 1 | uVar31;
          }
          else {
            if (iStack_178c == 0) goto LAB_00114b1a;
            uVar31 = (scalar_i & 1 | uVar31) ^ 1;
          }
          if (uVar31 != bVar1) goto LAB_00114b1f;
          secp256k1_ecdsa_recoverable_signature_convert
                    (local_1af8,(secp256k1_ecdsa_signature *)&generated,
                     (secp256k1_ecdsa_recoverable_signature *)seed16);
          secp256k1_scalar_set_b32(&expected_r,(uchar *)&generated,(int *)0x0);
          secp256k1_scalar_set_b32(&msg_plus_r_times_sk_s,(uchar *)(generated.x.n + 4),(int *)0x0);
          psVar39 = (secp256k1_context *)&expected_r_1;
          r_from_k((secp256k1_scalar *)psVar39,group,na,(int *)0x0);
          if (expected_r != expected_r_1) goto LAB_00114b24;
          sVar28 = na;
          uVar35 = msg_plus_r_times_sk_s * na;
          uVar31 = expected_r * iVar4 + iVar44;
          na_00 = (secp256k1_scratch *)(ulong)((uVar31 / 0xd) * 3);
          iVar6 = uVar31 - (uVar31 / 0xd + (uVar31 / 0xd) * 0xc);
          if (uVar35 - (uVar35 / 0xd + (uVar35 / 0xd) * 0xc) != iVar6) {
            uVar31 = (0xd - msg_plus_r_times_sk_s) * na;
            psVar39 = (secp256k1_context *)(ulong)((uVar31 / 0xd) * 3);
            if (uVar31 - (uVar31 / 0xd + (uVar31 / 0xd) * 0xc) != iVar6) goto LAB_00114b29;
          }
          if ((int)na < iVar27) break;
          iVar27 = na + 1;
          na = iVar27;
        } while ((int)sVar28 < 0xc);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 != 0xd);
    iVar44 = iVar44 + 1;
  } while (iVar44 != 0xd);
  local_1b18._0_4_ = 1;
  local_1b10 = 0;
  do {
    iVar44 = 1;
    do {
      iVar4 = 1;
      do {
        lVar8 = 1;
        do {
          bVar47 = true;
          if ((ulong)num_cores != 1) {
            local_1b10 = local_1b10 + 0xe7037ed1a0b428db;
            bVar47 = (uint32_t)
                     ((local_1b10 >> 0x20 ^ local_1b10 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
                     this_core;
          }
          if (bVar47) {
            _expected_r = CONCAT44(sStack_1ac4,(uint)local_1b18);
            secp256k1_scalar_verify(&expected_r);
            s = iVar44;
            secp256k1_scalar_verify(&s);
            ng = iVar4;
            secp256k1_scalar_verify(&ng);
            na = (int)lVar8;
            secp256k1_scalar_verify(&na);
            secp256k1_scalar_verify(&ng);
            _ng_1 = (undefined1  [16])0x0;
            local_1a98._0_15_ = SUB1615((undefined1  [16])0x0,0);
            local_1a98[0xf] = (char)iVar4;
            uVar31 = 0;
            sVar28 = 0;
            do {
              r_from_k((secp256k1_scalar *)seed16,group,sVar28,(int *)0x0);
              if (iVar44 == seed16._0_4_) {
                msg_plus_r_times_sk_s = sVar28;
                secp256k1_scalar_verify(&msg_plus_r_times_sk_s);
                secp256k1_scalar_mul(&msg_plus_r_times_sk_s,&msg_plus_r_times_sk_s,&expected_r);
                secp256k1_scalar_mul(&expected_r_1,&s,&na);
                secp256k1_scalar_add(&expected_r_1,&expected_r_1,&ng);
                secp256k1_scalar_verify(&msg_plus_r_times_sk_s);
                secp256k1_scalar_verify(&expected_r_1);
                uVar31 = uVar31 | msg_plus_r_times_sk_s == expected_r_1;
              }
              sVar28 = sVar28 + 1;
            } while (sVar28 != 0xd);
            secp256k1_scalar_verify(&expected_r);
            secp256k1_ecdsa_recoverable_signature_save
                      ((secp256k1_ecdsa_recoverable_signature *)&generated,&s,&expected_r,0);
            psVar39 = local_1af8;
            secp256k1_ecdsa_recoverable_signature_convert
                      (local_1af8,(secp256k1_ecdsa_signature *)&scalar_i,
                       (secp256k1_ecdsa_recoverable_signature *)&generated);
            psVar10 = group + lVar8;
            psVar33 = (secp256k1_ge *)seed16;
            for (lVar32 = 0xd; lVar32 != 0; lVar32 = lVar32 + -1) {
              (psVar33->x).n[0] = (psVar10->x).n[0];
              psVar10 = (secp256k1_ge *)((long)psVar10 + (ulong)bVar48 * -0x10 + 8);
              psVar33 = (secp256k1_ge *)((long)psVar33 + (ulong)bVar48 * -0x10 + 8);
            }
            secp256k1_pubkey_save((secp256k1_pubkey *)&tmp_3,(secp256k1_ge *)seed16);
            uVar35 = secp256k1_ecdsa_verify
                               (psVar39,(secp256k1_ecdsa_signature *)&scalar_i,(uchar *)&ng_1,
                                (secp256k1_pubkey *)&tmp_3);
            if (((uint)local_1b18 < 7 & uVar31) != uVar35) goto LAB_00114b2e;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0xd);
        iVar4 = iVar4 + 1;
      } while (iVar4 != 0xd);
      iVar44 = iVar44 + 1;
    } while (iVar44 != 0xd);
    local_1b18._0_4_ = (uint)local_1b18 + 1;
  } while ((uint)local_1b18 != 0xd);
  local_1b18 = (FILE *)0x1;
  puVar34 = local_17f8;
  psVar11 = &tmp_3;
  do {
    s = (int)local_1b18;
    secp256k1_scalar_verify(&s);
    secp256k1_scalar_verify(&s);
    _ng = (undefined1  [16])0x0;
    local_1a58._0_15_ = SUB1615((undefined1  [16])0x0,0);
    local_1a58[0xf] = (char)local_1b18;
    psVar39 = local_1af8;
    iVar44 = secp256k1_keypair_create
                       (local_1af8,(secp256k1_keypair *)(seed16 + ((long)local_1b18 - 1U) * 0x60),
                        (uchar *)&ng);
    if (iVar44 == 0) goto LAB_00114b33;
    pubkey = (secp256k1_pubkey *)((long)&generated.x + (long)local_1b18 * 0x40 + -0x40);
    psVar39 = local_1af8;
    iVar44 = secp256k1_ec_pubkey_create(local_1af8,pubkey,(uchar *)&ng);
    if (iVar44 == 0) goto LAB_00114b38;
    pubkey_00 = (secp256k1_xonly_pubkey *)(&scalar_i + (long)local_1b18 * 0x10 + -0x10);
    pk_parity = &ng_1 + ((long)local_1b18 - 1U);
    psVar39 = local_1af8;
    iVar44 = secp256k1_keypair_xonly_pub
                       (local_1af8,pubkey_00,(int *)pk_parity,
                        (secp256k1_keypair *)(seed16 + ((long)local_1b18 - 1U) * 0x60));
    if (iVar44 == 0) goto LAB_00114b3d;
    puVar30 = tmp_3.x.n + (long)local_1b18 * 4 + -4;
    psVar39 = local_1af8;
    iVar44 = secp256k1_xonly_pubkey_serialize(local_1af8,(uchar *)puVar30,pubkey_00);
    if (iVar44 == 0) goto LAB_00114b42;
    psVar39 = local_1af8;
    iVar44 = secp256k1_xonly_pubkey_parse(local_1af8,pubkey_00,(uchar *)puVar30);
    if (iVar44 == 0) goto LAB_00114b47;
    psVar39 = local_1af8;
    iVar44 = secp256k1_xonly_pubkey_serialize(local_1af8,(uchar *)&ng,pubkey_00);
    if (iVar44 == 0) goto LAB_00114b4c;
    lVar8 = 0;
    do {
      bVar1 = *(byte *)((long)(psVar11->x).n + lVar8);
      bVar2 = *(byte *)((long)&ng + lVar8);
      psVar39 = (secp256k1_context *)(ulong)bVar2;
      iVar44 = (uint)bVar1 - (uint)bVar2;
      if (bVar1 != bVar2) goto LAB_00114123;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x20);
    iVar44 = 0;
LAB_00114123:
    if (iVar44 != 0) goto LAB_00114b51;
    psVar39 = local_1af8;
    iVar44 = secp256k1_xonly_pubkey_from_pubkey(local_1af8,pubkey_00,(int *)&expected_r,pubkey);
    if (iVar44 == 0) goto LAB_00114b56;
    if (expected_r != *pk_parity) goto LAB_00114b5b;
    psVar39 = local_1af8;
    iVar44 = secp256k1_xonly_pubkey_serialize(local_1af8,(uchar *)&ng,pubkey_00);
    if (iVar44 == 0) goto LAB_00114b60;
    lVar8 = 0;
    do {
      bVar1 = *(byte *)((long)(psVar11->x).n + lVar8);
      bVar2 = *(byte *)((long)&ng + lVar8);
      psVar39 = (secp256k1_context *)(ulong)bVar2;
      iVar44 = (uint)bVar1 - (uint)bVar2;
      if (bVar1 != bVar2) goto LAB_0011419e;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x20);
    iVar44 = 0;
LAB_0011419e:
    if (iVar44 != 0) goto LAB_00114b65;
    psVar39 = (secp256k1_context *)&na;
    secp256k1_fe_impl_set_b32_mod((secp256k1_fe *)psVar39,(uchar *)puVar30);
    uStack_1a10 = (void *)0x1;
    secp256k1_fe_verify((secp256k1_fe *)psVar39);
    iVar44 = secp256k1_fe_equal((secp256k1_fe *)psVar39,&group[(long)local_1b18].x);
    if (iVar44 == 0) goto LAB_00114b6a;
    _na = (uchar  [8])group[(long)local_1b18].y.n[0];
    pvStack_1a30 = (void *)group[(long)local_1b18].y.n[1];
    local_1a28 = (_func_void_char_ptr_void_ptr *)group[(long)local_1b18].y.n[2];
    pvStack_1a20 = (void *)group[(long)local_1b18].y.n[3];
    local_1a18 = (undefined4)group[(long)local_1b18].y.n[4];
    uStack_1a14 = *(undefined4 *)((long)group[(long)local_1b18].y.n + 0x24);
    uStack_1a10 = (void *)CONCAT44(group[(long)local_1b18].y.normalized,
                                   group[(long)local_1b18].y.magnitude);
    psVar39 = (secp256k1_context *)&na;
    secp256k1_fe_normalize_var((secp256k1_fe *)psVar39);
    secp256k1_fe_verify((secp256k1_fe *)psVar39);
    if (uStack_1a10._4_4_ == 0) goto LAB_00114b6f;
    if ((na & 1) != *pk_parity) goto LAB_00114b74;
    if (6 < local_1b18) {
      lVar8 = 0;
      psVar13 = extraout_RDX;
      do {
        psVar39 = (secp256k1_context *)((ulong)psVar13 & 0xffffffff);
        bVar1 = *(byte *)((long)(psVar11->x).n + lVar8);
        na_00 = (secp256k1_scratch *)(ulong)bVar1;
        bVar2 = puVar34[lVar8];
        psVar13 = (secp256k1_context *)(ulong)((uint)bVar1 - (uint)bVar2);
        if (bVar1 == bVar2) {
          psVar13 = psVar39;
        }
        iVar44 = (int)psVar13;
        if (bVar1 != bVar2) goto LAB_0011428f;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x20);
      iVar44 = 0;
LAB_0011428f:
      if (iVar44 != 0) goto LAB_00114b79;
      if (*pk_parity != 1 - (&ng_1)[0xc - (long)local_1b18]) goto LAB_00114b7e;
    }
    local_1b18 = (FILE *)((long)local_1b18 + 1);
    psVar11 = (secp256k1_gej *)((psVar11->x).n + 4);
    puVar34 = puVar34 + -0x20;
  } while (local_1b18 != (FILE *)0xd);
  lVar8 = 0;
  do {
    psVar39 = local_1af8;
    iVar44 = secp256k1_xonly_pubkey_parse
                       (local_1af8,(secp256k1_xonly_pubkey *)seed16,invalid_pubkey_bytes[0] + lVar8)
    ;
    if (iVar44 != 0) goto LAB_00114b83;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0xe0);
  iVar44 = 1;
  keypair = (secp256k1_keypair *)seed16;
  psVar10 = &generated;
  output32 = &scalar_i;
  lVar8 = 0;
  do {
    ng_1 = iVar44;
    secp256k1_scalar_verify(&ng_1);
    secp256k1_scalar_verify(&ng_1);
    tmp_3.x.n[0] = 0;
    tmp_3.x.n[1] = 0;
    tmp_3.x.n._16_15_ = SUB1615((undefined1  [16])0x0,0);
    tmp_3.x.n[3]._7_1_ = (char)iVar44;
    psVar39 = local_1af8;
    iVar4 = secp256k1_keypair_create(local_1af8,keypair,(uchar *)&tmp_3);
    if (iVar4 == 0) goto LAB_00114b88;
    psVar39 = local_1af8;
    iVar4 = secp256k1_keypair_xonly_pub
                      (local_1af8,(secp256k1_xonly_pubkey *)psVar10,(int *)((long)&na + lVar8),
                       keypair);
    if (iVar4 == 0) goto LAB_00114b8d;
    psVar39 = local_1af8;
    iVar4 = secp256k1_xonly_pubkey_serialize
                      (local_1af8,(uchar *)output32,(secp256k1_xonly_pubkey *)psVar10);
    if (iVar4 == 0) goto LAB_00114b92;
    lVar8 = lVar8 + 4;
    output32 = output32 + 8;
    psVar10 = (secp256k1_ge *)((psVar10->y).n + 2);
    keypair = keypair + 1;
    iVar44 = iVar44 + 1;
  } while (lVar8 != 0x30);
  local_1ab8 = (secp256k1_scalar *)0x0;
  _expected_r = 0x8cb36fda;
  p_Stack_1ac0 = (secp256k1_nonce_function_hardened)0x0;
  local_1b08 = 1;
  local_1b10 = 0;
  do {
    iVar44 = 0xd - (int)local_1b08;
    if ((&iStack_1a3c)[local_1b08] == 0) {
      iVar44 = (int)local_1b08;
    }
    msg_plus_r_times_sk_s = 1;
    do {
      local_1a88 = (undefined1  [16])0x0;
      local_1a98 = (undefined1  [16])0x0;
      _ng_1 = (undefined1  [16])0x0;
      local_1a78 = 0;
      bVar47 = true;
      if ((ulong)num_cores != 1) {
        local_1b10 = local_1b10 + 0xe7037ed1a0b428db;
        bVar47 = (uint32_t)
                 ((local_1b10 >> 0x20 ^ local_1b10 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
                 this_core;
      }
      if (bVar47) {
        p_Stack_1ac0 = secp256k1_hardened_nonce_function_smallint;
        local_1ab8 = &msg_plus_r_times_sk_s;
        sVar28 = 0xd - msg_plus_r_times_sk_s;
        if ((&iStack_1a3c)[(int)msg_plus_r_times_sk_s] == 0) {
          sVar28 = msg_plus_r_times_sk_s;
        }
        iVar4 = 0;
        do {
          testrand256((uchar *)&ng);
          na_00 = (secp256k1_scratch *)(&scalar_i + (local_1b08 + -1) * 8);
          secp256k1_schnorrsig_challenge
                    (&expected_r_1,rand32 + (long)(int)msg_plus_r_times_sk_s * 0x20,(uchar *)&ng,
                     0x20,(uchar *)(&scalar_i + (local_1b08 + -1) * 8));
          uVar25 = (ulong)expected_r_1;
          if ((&ng_1)[uVar25] == 0) {
            uVar31 = expected_r_1 * iVar44 + sVar28;
            sVar45 = uVar31 - (uVar31 / 0xd + (uVar31 / 0xd) * 0xc);
            expected_s = sVar45;
            secp256k1_scalar_verify(&expected_s);
            _s = (undefined1  [16])0x0;
            local_19c8._0_15_ = SUB1615((undefined1  [16])0x0,0);
            local_19c8[0xf] = (char)sVar45;
            psVar39 = local_1af8;
            iVar27 = secp256k1_schnorrsig_sign_custom
                               (local_1af8,(uchar *)&tmp_3,(uchar *)&ng,0x20,
                                (secp256k1_keypair *)(seed16 + (local_1b08 + -1) * 0x60),
                                (secp256k1_schnorrsig_extraparams *)&expected_r);
            if (iVar27 == 0) goto LAB_00114b97;
            puVar24 = rand32;
            puVar20 = puVar24 + (long)(int)msg_plus_r_times_sk_s * 0x20;
            lVar8 = 0;
            do {
              puVar37 = (uchar *)((ulong)puVar24 & 0xffffffff);
              bVar1 = *(byte *)((long)tmp_3.x.n + lVar8);
              psVar39 = (secp256k1_context *)(ulong)bVar1;
              bVar2 = puVar20[lVar8];
              na_00 = (secp256k1_scratch *)(ulong)bVar2;
              puVar24 = (uchar *)(ulong)((uint)bVar1 - (uint)bVar2);
              if (bVar1 == bVar2) {
                puVar24 = puVar37;
              }
              iVar27 = (int)puVar24;
              if (bVar1 != bVar2) goto LAB_001145da;
              lVar8 = lVar8 + 1;
            } while (lVar8 != 0x20);
            iVar27 = 0;
LAB_001145da:
            if (iVar27 != 0) goto LAB_00114b9c;
            lVar8 = 0;
            do {
              puVar24 = (uchar *)((ulong)puVar20 & 0xffffffff);
              bVar1 = *(byte *)((long)tmp_3.x.n + lVar8 + 0x20);
              bVar2 = *(byte *)((long)&s + lVar8);
              psVar39 = (secp256k1_context *)(ulong)bVar2;
              puVar20 = (uchar *)(ulong)((uint)bVar1 - (uint)bVar2);
              if (bVar1 == bVar2) {
                puVar20 = puVar24;
              }
              iVar27 = (int)puVar20;
              if (bVar1 != bVar2) goto LAB_0011460d;
              lVar8 = lVar8 + 1;
            } while (lVar8 != 0x20);
            iVar27 = 0;
LAB_0011460d:
            if (iVar27 != 0) goto LAB_00114ba1;
            (&ng_1)[uVar25] = 1;
            iVar4 = iVar4 + 1;
          }
        } while (iVar4 < 0xd);
      }
      sVar28 = msg_plus_r_times_sk_s + 1;
      bVar47 = (int)msg_plus_r_times_sk_s < 0xc;
      msg_plus_r_times_sk_s = sVar28;
    } while (bVar47);
    local_1b08 = local_1b08 + 1;
  } while (local_1b08 != 0xd);
  local_1ae8 = (secp256k1_ge *)0x1;
  local_1ae0 = (secp256k1_ge *)0x0;
  do {
    puVar34 = &local_1ae8[-1].field_0x67;
    local_1a58 = *(undefined1 (*) [16])(local_17a8 + (long)puVar34 * 0x20);
    iVar44 = 0xd - (int)local_1ae8;
    if ((&iStack_1a3c)[(long)local_1ae8] == 0) {
      iVar44 = (int)local_1ae8;
    }
    local_1ad8 = (secp256k1_gej *)CONCAT44(local_1ad8._4_4_,iVar44);
    uStack_1a60 = *(undefined8 *)(local_17a8 + (long)puVar34 * 0x20 + -8);
    _ng = *(undefined8 *)(&scalar_i + (long)puVar34 * 8);
    psVar14 = (secp256k1_scratch *)((long)&generated.x + (long)puVar34 * 0x40);
    local_1b08 = 1;
    do {
      local_1a88 = (undefined1  [16])0x0;
      local_1a98 = (undefined1  [16])0x0;
      _ng_1 = (undefined1  [16])0x0;
      local_1a78 = 0;
      bVar47 = true;
      if ((ulong)num_cores != 1) {
        local_1ae0 = (secp256k1_ge *)((long)local_1ae0[-0x3d813dfbfe4488].x.n + 0x1b);
        bVar47 = (uint32_t)
                 (((ulong)local_1ae0 >> 0x20 ^ (ulong)local_1ae0 & 0xffffffff) * (ulong)num_cores >>
                 0x20) == this_core;
      }
      if (bVar47) {
        iVar44 = (int)local_1b08;
        if (local_1b08 < 7) {
          lVar8 = (local_1b08 - 1) * 0x20;
          tmp_3.x.n._16_16_ = *(undefined1 (*) [16])(local_17a8 + lVar8);
          tmp_3.x.n[1] = *(uint64_t *)(local_17a8 + lVar8 + -8);
          tmp_3.x.n[0] = *(uint64_t *)(&scalar_i + (local_1b08 - 1) * 8);
          iVar4 = 0xd - iVar44;
          if ((&iStack_1a3c)[local_1b08] == 0) {
            iVar4 = iVar44;
          }
        }
        else {
          tmp_3.x.n._0_16_ = *(undefined1 (*) [16])invalid_pubkey_bytes[iVar44 - 7U];
          tmp_3.x.n._16_16_ = *(undefined1 (*) [16])(invalid_pubkey_bytes[iVar44 - 7U] + 0x10);
          iVar4 = -1;
        }
        local_19f8 = (char **)CONCAT44(local_19f8._4_4_,(uint)(iVar4 != -1));
        iVar44 = 0;
        do {
          testrand256((uchar *)&s);
          na_00 = (secp256k1_scratch *)&ng;
          secp256k1_schnorrsig_challenge
                    (&expected_r,(uchar *)&tmp_3,(uchar *)&s,0x20,(uchar *)na_00);
          uVar25 = _expected_r & 0xffffffff;
          if ((&ng_1)[uVar25] == 0) {
            uVar31 = (int)_expected_r * (int)local_1ad8 + iVar4;
            iVar6 = 0;
            iVar27 = 0;
            do {
              if (iVar6 == 0xe) {
                testrand256((uchar *)(tmp_3.x.n + 4));
                uVar35 = 0;
              }
              else {
                tmp_3.x.n[4] = 0;
                tmp_3.x.magnitude = 0;
                tmp_3.x.normalized = 0;
                tmp_3.y.n._0_12_ = SUB1612((undefined1  [16])0x0,0);
                tmp_3.y.n[1]._4_4_ = 0;
                uVar35 = 0;
                if (iVar6 != 0xd && iVar4 != -1) {
                  uVar35 = (uint)(uVar31 - (uVar31 / 0xd + (uVar31 / 0xd) * 0xc) == iVar6);
                }
              }
              psVar39 = local_1af8;
              na_00 = psVar14;
              uVar7 = secp256k1_schnorrsig_verify
                                (local_1af8,(uchar *)&tmp_3,(uchar *)&s,0x20,
                                 (secp256k1_xonly_pubkey *)psVar14);
              if (uVar7 != uVar35) goto LAB_00114ba6;
              iVar27 = iVar27 + uVar7;
              iVar6 = iVar6 + 1;
            } while (iVar6 != 0xf);
            if (iVar27 != (int)local_19f8) goto LAB_00114bab;
            (&ng_1)[uVar25] = 1;
            iVar44 = iVar44 + 1;
          }
        } while (iVar44 < 0xd);
      }
      local_1b08 = local_1b08 + 1;
    } while (local_1b08 != 0xe);
    local_1ae8 = (secp256k1_ge *)((long)(local_1ae8->x).n + 1);
  } while (local_1ae8 != (secp256k1_ge *)0x7);
  lVar8 = 0x68;
  iVar44 = 1;
  do {
    ng_1 = iVar44;
    secp256k1_scalar_verify(&ng_1);
    secp256k1_scalar_verify(&ng_1);
    tmp_3.x.n[0] = 0;
    tmp_3.x.n[1] = 0;
    tmp_3.x.n._16_15_ = SUB1615((undefined1  [16])0x0,0);
    tmp_3.x.n[3]._7_1_ = (char)iVar44;
    psVar39 = local_1af8;
    iVar4 = secp256k1_ellswift_create(local_1af8,(uchar *)&generated,(uchar *)&tmp_3,(uchar *)0x0);
    psVar13 = local_1af8;
    if (iVar4 == 0) goto LAB_00114bb0;
    secp256k1_ellswift_decode(local_1af8,(secp256k1_pubkey *)&scalar_i,(uchar *)&generated);
    psVar39 = (secp256k1_context *)seed16;
    secp256k1_pubkey_load(psVar13,(secp256k1_ge *)psVar39,(secp256k1_pubkey *)&scalar_i);
    iVar4 = secp256k1_ge_eq_var((secp256k1_ge *)psVar39,(secp256k1_ge *)((long)group[0].x.n + lVar8)
                               );
    if (iVar4 == 0) goto LAB_00114bb5;
    lVar8 = lVar8 + 0x68;
    iVar44 = iVar44 + 1;
  } while (lVar8 != 0x548);
  secp256k1_context_destroy(local_1af8);
  iVar44 = count;
  goto joined_r0x0011246c;
LAB_00114a70:
  main_cold_4();
LAB_00114a75:
  main_cold_5();
LAB_00114a7a:
  main_cold_6();
LAB_00114a7f:
  main_cold_69();
LAB_00114a84:
  main_cold_68();
LAB_00114a89:
  main_cold_67();
LAB_00114a8e:
  main_cold_7();
LAB_00114a93:
  main_cold_8();
LAB_00114a98:
  main_cold_50();
LAB_00114a9d:
  psVar39 = psVar13;
  main_cold_61();
LAB_00114aa2:
  main_cold_60();
LAB_00114aa7:
  main_cold_59();
LAB_00114aac:
  main_cold_58();
LAB_00114ab1:
  main_cold_56();
LAB_00114ab6:
  psVar13 = psVar39;
  main_cold_55();
LAB_00114abb:
  main_cold_54();
LAB_00114ac0:
  psVar39 = psVar13;
  main_cold_52();
LAB_00114ac5:
  main_cold_51();
LAB_00114aca:
  main_cold_71();
LAB_00114acf:
  main_cold_3();
LAB_00114ad4:
  main_cold_70();
LAB_00114ad9:
  main_cold_66();
LAB_00114ade:
  main_cold_65();
  goto LAB_00114ae3;
}

Assistant:

int main(int argc, char** argv) {
    int i;
    secp256k1_gej groupj[EXHAUSTIVE_TEST_ORDER];
    secp256k1_ge group[EXHAUSTIVE_TEST_ORDER];
    unsigned char rand32[32];
    secp256k1_context *ctx;

    /* Disable buffering for stdout to improve reliability of getting
     * diagnostic information. Happens right at the start of main because
     * setbuf must be used before any other operation on the stream. */
    setbuf(stdout, NULL);
    /* Also disable buffering for stderr because it's not guaranteed that it's
     * unbuffered on all systems. */
    setbuf(stderr, NULL);

    printf("Exhaustive tests for order %lu\n", (unsigned long)EXHAUSTIVE_TEST_ORDER);

    /* find iteration count */
    if (argc > 1) {
        count = strtol(argv[1], NULL, 0);
    }
    printf("test count = %i\n", count);

    /* find random seed */
    testrand_init(argc > 2 ? argv[2] : NULL);

    /* set up split processing */
    if (argc > 4) {
        num_cores = strtol(argv[3], NULL, 0);
        this_core = strtol(argv[4], NULL, 0);
        if (num_cores < 1 || this_core >= num_cores) {
            fprintf(stderr, "Usage: %s [count] [seed] [numcores] [thiscore]\n", argv[0]);
            return 1;
        }
        printf("running tests for core %lu (out of [0..%lu])\n", (unsigned long)this_core, (unsigned long)num_cores - 1);
    }

    /* Recreate the ecmult{,_gen} tables using the right generator (as selected via EXHAUSTIVE_TEST_ORDER) */
    secp256k1_ecmult_gen_compute_table(&secp256k1_ecmult_gen_prec_table[0][0], &secp256k1_ge_const_g, COMB_BLOCKS, COMB_TEETH, COMB_SPACING);
    secp256k1_ecmult_compute_two_tables(secp256k1_pre_g, secp256k1_pre_g_128, WINDOW_G, &secp256k1_ge_const_g);

    while (count--) {
        /* Build context */
        ctx = secp256k1_context_create(SECP256K1_CONTEXT_NONE);
        testrand256(rand32);
        CHECK(secp256k1_context_randomize(ctx, rand32));

        /* Generate the entire group */
        secp256k1_gej_set_infinity(&groupj[0]);
        secp256k1_ge_set_gej(&group[0], &groupj[0]);
        for (i = 1; i < EXHAUSTIVE_TEST_ORDER; i++) {
            secp256k1_gej_add_ge(&groupj[i], &groupj[i - 1], &secp256k1_ge_const_g);
            secp256k1_ge_set_gej(&group[i], &groupj[i]);
            if (count != 0) {
                /* Set a different random z-value for each Jacobian point, except z=1
                   is used in the last iteration. */
                secp256k1_fe z;
                testutil_random_fe(&z);
                secp256k1_gej_rescale(&groupj[i], &z);
            }

            /* Verify against ecmult_gen */
            {
                secp256k1_scalar scalar_i;
                secp256k1_gej generatedj;
                secp256k1_ge generated;

                secp256k1_scalar_set_int(&scalar_i, i);
                secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &generatedj, &scalar_i);
                secp256k1_ge_set_gej(&generated, &generatedj);

                CHECK(group[i].infinity == 0);
                CHECK(generated.infinity == 0);
                CHECK(secp256k1_fe_equal(&generated.x, &group[i].x));
                CHECK(secp256k1_fe_equal(&generated.y, &group[i].y));
            }
        }

        /* Run the tests */
        test_exhaustive_endomorphism(group);
        test_exhaustive_addition(group, groupj);
        test_exhaustive_ecmult(group, groupj);
        test_exhaustive_ecmult_multi(ctx, group);
        test_exhaustive_sign(ctx, group);
        test_exhaustive_verify(ctx, group);

#ifdef ENABLE_MODULE_RECOVERY
        test_exhaustive_recovery(ctx, group);
#endif
#ifdef ENABLE_MODULE_EXTRAKEYS
        test_exhaustive_extrakeys(ctx, group);
#endif
#ifdef ENABLE_MODULE_SCHNORRSIG
        test_exhaustive_schnorrsig(ctx);
#endif
#ifdef ENABLE_MODULE_ELLSWIFT
    /* The ellswift algorithm does have additional edge cases when operating on
     * curves of even order, which are not included in the code as secp256k1 is
     * of odd order. Skip the ellswift tests if the used exhaustive tests curve
     * is even-ordered accordingly. */
    #if !EXHAUSTIVE_TEST_CURVE_HAS_EVEN_ORDER
        test_exhaustive_ellswift(ctx, group);
    #endif
#endif

        secp256k1_context_destroy(ctx);
    }

    testrand_finish();

    printf("no problems found\n");
    return 0;
}